

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

int __thiscall RenX::Server::sendAdminMessage(Server *this,string_view message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  rep rVar6;
  char *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  undefined8 uVar9;
  size_type *psVar10;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_type *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  
  str._M_len = message._M_str;
  paVar1 = &local_68.field_2;
  local_68.field_2._M_allocated_capacity._0_4_ = 0x736d6163;
  local_68.field_2._M_allocated_capacity._4_2_ = 0x2067;
  local_68._M_string_length = 6;
  local_68.field_2._M_local_buf[6] = '\0';
  str._M_str = in_RCX;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  escapifyRCON_abi_cxx11_(&local_88,(RenX *)message._M_len,str);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    uVar8 = CONCAT17(local_68.field_2._M_local_buf[7],
                     CONCAT16(local_68.field_2._M_local_buf[6],
                              CONCAT24(local_68.field_2._M_allocated_capacity._4_2_,
                                       local_68.field_2._M_allocated_capacity._0_4_)));
  }
  if (uVar8 < local_88._M_string_length + local_68._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar9 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_68._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_88,0,0,local_68._M_dataplus._M_p,local_68._M_string_length);
      goto LAB_001311bb;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_68,local_88._M_dataplus._M_p,local_88._M_string_length);
LAB_001311bb:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar2 == paVar7) {
    local_a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_a8._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_a8,local_a8._M_string_length,0,1,'\n');
  psVar10 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10 == paVar7) {
    local_38 = paVar7->_M_allocated_capacity;
    uStack_30 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    psVar10 = &local_38;
  }
  else {
    local_38 = paVar7->_M_allocated_capacity;
  }
  sVar3 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_48 = psVar10;
  local_40 = sVar3;
  rVar6 = std::chrono::_V2::steady_clock::now();
  (this->m_lastSendActivity).__d.__r = rVar6;
  iVar4 = Jupiter::Socket::send(&this->m_sock,sVar3,psVar10);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT17(local_68.field_2._M_local_buf[7],
                             CONCAT16(local_68.field_2._M_local_buf[6],
                                      CONCAT24(local_68.field_2._M_allocated_capacity._4_2_,
                                               local_68.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  return iVar4;
}

Assistant:

int RenX::Server::sendAdminMessage(std::string_view message) {
	return sendSocket("camsg "s + RenX::escapifyRCON(message) + '\n');
}